

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matras.cc
# Opt level: O1

void matras_stats_test(void)

{
  size_t sVar1;
  uint uVar2;
  uint uVar3;
  void *pvVar4;
  char *m;
  char *pcVar5;
  int iVar6;
  ulong uVar7;
  matras mStack_2b8;
  matras_view mStack_260;
  matras_view mStack_240;
  uint uStack_21c;
  matras *pmStack_218;
  matras *pmStack_210;
  undefined *puStack_208;
  matras_id_t *pmStack_200;
  ulong uStack_1f8;
  code *pcStack_1f0;
  matras mStack_1e0;
  uint uStack_184;
  matras *pmStack_180;
  matras *pmStack_178;
  undefined *puStack_170;
  matras_id_t *pmStack_168;
  ulong uStack_160;
  code *apcStack_158 [2];
  matras mStack_148;
  uint uStack_ec;
  matras *pmStack_e8;
  matras *pmStack_e0;
  char *pcStack_d8;
  char *pcStack_d0;
  matras_stats *pmStack_c8;
  code *pcStack_c0;
  undefined1 local_b8 [8];
  matras matras;
  matras_view view;
  matras_id_t mStack_38;
  matras_id_t id;
  matras_stats stats;
  
  pcStack_c0 = (code *)0x103a26;
  _space(_stdout);
  pcStack_c0 = (code *)0x103a3e;
  printf("# *** %s ***\n","matras_stats_test");
  pcStack_c0 = (code *)0x103a48;
  plan(0xc);
  mStack_38 = 0;
  id = 0;
  pcVar5 = "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/matras.cc";
  m = "line %d";
  pcStack_c0 = (code *)0x103a81;
  _ok(1,"stats.extent_count == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/matras.cc",0x123,
      "line %d",0x123);
  pcStack_c0 = (code *)0x103aae;
  _ok((uint)(id == 0),"stats.read_view_extent_count == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/matras.cc",0x124,
      "line %d",0x124);
  extents_in_use = 0;
  pcStack_c0 = (code *)0x103ad3;
  matras_create((matras *)local_b8,8,&ver_allocator,(matras_stats *)&stack0xffffffffffffffc8);
  pcStack_c0 = (code *)0x103afc;
  _ok((uint)(mStack_38 == 0),"stats.extent_count == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/matras.cc",0x129,
      "line %d",0x129);
  pcStack_c0 = (code *)0x103b22;
  _ok((uint)(id == 0),"stats.read_view_extent_count == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/matras.cc",0x12a,
      "line %d",0x12a);
  pcStack_c0 = (code *)0x103b2e;
  pvVar4 = matras_alloc((matras *)local_b8,(matras_id_t *)((long)&view.next_view + 4));
  if (pvVar4 == (void *)0x0) {
    pcStack_c0 = (code *)0x103d1c;
    matras_stats_test();
  }
  else {
    pcVar5 = "line %d";
    pcStack_c0 = (code *)0x103b6e;
    _ok((uint)(mStack_38 == 3),"stats.extent_count == 3",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/matras.cc",0x12e,
        "line %d",0x12e);
    pcStack_c0 = (code *)0x103b97;
    _ok((uint)(id == 0),"stats.read_view_extent_count == 0",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/matras.cc",0x12f,
        "line %d",0x12f);
    m = local_b8;
    pcStack_c0 = (code *)0x103baa;
    matras_create_read_view((matras *)m,(matras_view *)&matras.stats);
    pcStack_c0 = (code *)0x103bb5;
    pvVar4 = matras_touch((matras *)m,view.next_view._4_4_);
    if (pvVar4 != (void *)0x0) {
      pcStack_c0 = (code *)0x103bf5;
      _ok((uint)(mStack_38 == 6),"stats.extent_count == 6",
          "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/matras.cc",0x134
          ,"line %d",0x134);
      pcStack_c0 = (code *)0x103c1e;
      _ok((uint)(id == 3),"stats.read_view_extent_count == 3",
          "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/matras.cc",0x135
          ,"line %d",0x135);
      pcStack_c0 = (code *)0x103c31;
      matras_destroy_read_view((matras *)local_b8,(matras_view *)&matras.stats);
      pcStack_c0 = (code *)0x103c5a;
      _ok((uint)(mStack_38 == 3),"stats.extent_count == 3",
          "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/matras.cc",0x138
          ,"line %d",0x138);
      pcStack_c0 = (code *)0x103c86;
      _ok((uint)(id == 0),"stats.read_view_extent_count == 0",
          "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/matras.cc",0x139
          ,"line %d",0x139);
      pcStack_c0 = (code *)0x103c8e;
      matras_destroy((matras *)local_b8);
      pcStack_c0 = (code *)0x103cb7;
      _ok((uint)(mStack_38 == 0),"stats.extent_count == 0",
          "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/matras.cc",0x13c
          ,"line %d",0x13c);
      pcStack_c0 = (code *)0x103cdc;
      _ok((uint)(id == 0),"stats.read_view_extent_count == 0",
          "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/matras.cc",0x13d
          ,"line %d",0x13d);
      pcStack_c0 = (code *)0x103ceb;
      _space(_stdout);
      pcStack_c0 = (code *)0x103d00;
      printf("# *** %s: done ***\n","matras_stats_test");
      pcStack_c0 = (code *)0x103d05;
      check_plan();
      return;
    }
  }
  pcStack_c0 = matras_alloc_overflow_test;
  matras_stats_test();
  pcStack_d8 = "stats.read_view_extent_count == 0";
  apcStack_158[0] = (code *)0x103d42;
  pmStack_e8 = (matras *)m;
  pmStack_e0 = (matras *)local_b8;
  pcStack_d0 = pcVar5;
  pmStack_c8 = (matras_stats *)&stack0xffffffffffffffc8;
  pcStack_c0 = (code *)&stack0xfffffffffffffff8;
  _space(_stdout);
  uVar7 = 0;
  apcStack_158[0] = (code *)0x103d5a;
  printf("# *** %s ***\n","matras_alloc_overflow_test");
  apcStack_158[0] = (code *)0x103d64;
  plan(2);
  apcStack_158[0] = (code *)0x103d81;
  matras_create(&mStack_148,0x10,&pta_allocator,(matras_stats *)0x0);
  while( true ) {
    apcStack_158[0] = (code *)0x103d90;
    pvVar4 = matras_alloc(&mStack_148,&uStack_ec);
    if (pvVar4 == (void *)0x0) break;
    if (uVar7 != uStack_ec) goto LAB_00103e68;
    uVar7 = uVar7 + 1;
    if (uVar7 == 0x100) {
      apcStack_158[0] = (code *)0x103dc7;
      pvVar4 = matras_alloc(&mStack_148,&uStack_ec);
      apcStack_158[0] = (code *)0x103dfd;
      _ok((uint)(pvVar4 == (void *)0x0),"matras_alloc(&mat, &id) == NULL",
          "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/matras.cc",0x156
          ,"line %d",0x156);
      apcStack_158[0] = (code *)0x103e29;
      _ok((uint)(uStack_ec == 0xff),"id == max_capacity - 1",
          "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/matras.cc",0x157
          ,"line %d",0x157);
      apcStack_158[0] = (code *)0x103e31;
      matras_destroy(&mStack_148);
      apcStack_158[0] = (code *)0x103e3a;
      _space(_stdout);
      apcStack_158[0] = (code *)0x103e4f;
      printf("# *** %s: done ***\n","matras_alloc_overflow_test");
      apcStack_158[0] = (code *)0x103e54;
      check_plan();
      return;
    }
  }
  apcStack_158[0] = (code *)0x103e68;
  matras_alloc_overflow_test();
LAB_00103e68:
  apcStack_158[0] = matras_alloc_range_overflow_test;
  matras_alloc_overflow_test();
  puStack_170 = &stdout;
  pcStack_1f0 = (code *)0x103e8e;
  pmStack_180 = &mStack_148;
  pmStack_178 = (matras *)local_b8;
  pmStack_168 = &uStack_ec;
  uStack_160 = uVar7;
  apcStack_158[0] = (code *)&pcStack_c0;
  _space(_stdout);
  pcStack_1f0 = (code *)0x103ea3;
  printf("# *** %s ***\n","matras_alloc_range_overflow_test");
  pcStack_1f0 = (code *)0x103ead;
  plan(2);
  pcStack_1f0 = (code *)0x103eca;
  matras_create(&mStack_1e0,0x10,&pta_allocator,(matras_stats *)0x0);
  uVar7 = 0xfffffffffffffffc;
  while( true ) {
    pcStack_1f0 = (code *)0x103ee5;
    pvVar4 = matras_alloc_range(&mStack_1e0,&uStack_184,4);
    if (pvVar4 == (void *)0x0) break;
    uVar7 = uVar7 + 4;
    if (uVar7 != uStack_184) goto LAB_00103fc3;
    if (0xfb < uVar7) {
      pcStack_1f0 = (code *)0x103f22;
      pvVar4 = matras_alloc_range(&mStack_1e0,&uStack_184,4);
      pcStack_1f0 = (code *)0x103f58;
      _ok((uint)(pvVar4 == (void *)0x0),"matras_alloc_range(&mat, &id, range_count) == NULL",
          "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/matras.cc",0x172
          ,"line %d",0x172);
      pcStack_1f0 = (code *)0x103f84;
      _ok((uint)(uStack_184 == 0xfc),"id == max_capacity - range_count",
          "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/matras.cc",0x173
          ,"line %d",0x173);
      pcStack_1f0 = (code *)0x103f8c;
      matras_destroy(&mStack_1e0);
      pcStack_1f0 = (code *)0x103f95;
      _space(_stdout);
      pcStack_1f0 = (code *)0x103faa;
      printf("# *** %s: done ***\n","matras_alloc_range_overflow_test");
      pcStack_1f0 = (code *)0x103faf;
      check_plan();
      return;
    }
  }
  pcStack_1f0 = (code *)0x103fc3;
  matras_alloc_range_overflow_test();
LAB_00103fc3:
  pcStack_1f0 = matras_touch_reserve_test;
  matras_alloc_range_overflow_test();
  puStack_208 = &stdout;
  pmStack_218 = &mStack_1e0;
  pmStack_210 = (matras *)local_b8;
  pmStack_200 = &uStack_184;
  uStack_1f8 = uVar7;
  pcStack_1f0 = (code *)apcStack_158;
  _space(_stdout);
  uVar7 = 0;
  printf("# *** %s ***\n","matras_touch_reserve_test");
  plan(0xe);
  matras_create(&mStack_2b8,0x10,&pta_allocator,(matras_stats *)0x0);
  matras_create_read_view(&mStack_2b8,&mStack_260);
  do {
    pvVar4 = matras_alloc(&mStack_2b8,&uStack_21c);
    if (pvVar4 == (void *)0x0) {
      matras_touch_reserve_test();
LAB_00104551:
      matras_touch_reserve_test();
      goto LAB_00104556;
    }
    if (uVar7 != uStack_21c) goto LAB_00104551;
    uVar7 = uVar7 + 1;
  } while (uVar7 != 0x100);
  pvVar4 = matras_alloc(&mStack_2b8,&uStack_21c);
  iVar6 = 0;
  _ok((uint)(pvVar4 == (void *)0x0),"matras_alloc(&mat, &id) == NULL",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/matras.cc",0x195,
      "line %d",0x195);
  _ok((uint)(uStack_21c == 0xff),"id == max_capacity - 1",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/matras.cc",0x196,
      "line %d",0x196);
  sVar1 = AllocatedCount;
  matras_touch_reserve(&mStack_2b8,0);
  _ok((uint)(AllocatedCount == sVar1),"AllocatedCount == extents_in_use_before_reserve",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/matras.cc",0x19b,
      "line %d",0x19b);
  matras_touch_reserve(&mStack_2b8,1);
  _ok((uint)(AllocatedCount == sVar1),"AllocatedCount == extents_in_use_before_reserve",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/matras.cc",0x19d,
      "line %d",0x19d);
  matras_touch_reserve(&mStack_2b8,0x80);
  _ok((uint)(AllocatedCount == sVar1),"AllocatedCount == extents_in_use_before_reserve",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/matras.cc",0x19f,
      "line %d",0x19f);
  matras_touch_reserve(&mStack_2b8,0x100);
  _ok((uint)(AllocatedCount == sVar1),"AllocatedCount == extents_in_use_before_reserve",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/matras.cc",0x1a1,
      "line %d",0x1a1);
  matras_destroy_read_view(&mStack_2b8,&mStack_260);
  sVar1 = AllocatedCount;
  matras_touch_reserve(&mStack_2b8,0);
  _ok((uint)(AllocatedCount == sVar1),"AllocatedCount == extents_in_use_before_reserve",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/matras.cc",0x1a7,
      "line %d",0x1a7);
  matras_touch_reserve(&mStack_2b8,1);
  _ok((uint)(AllocatedCount == sVar1),"AllocatedCount == extents_in_use_before_reserve",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/matras.cc",0x1a9,
      "line %d",0x1a9);
  matras_touch_reserve(&mStack_2b8,0x80);
  _ok((uint)(AllocatedCount == sVar1),"AllocatedCount == extents_in_use_before_reserve",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/matras.cc",0x1ab,
      "line %d",0x1ab);
  matras_touch_reserve(&mStack_2b8,0x100);
  _ok((uint)(AllocatedCount == sVar1),"AllocatedCount == extents_in_use_before_reserve",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/matras.cc",0x1ad,
      "line %d",0x1ad);
  matras_create_read_view(&mStack_2b8,&mStack_240);
  sVar1 = AllocatedCount;
  matras_touch_reserve(&mStack_2b8,2);
  _ok((uint)(AllocatedCount == sVar1 + 5),"AllocatedCount == extents_in_use_before_reserve + 5",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/matras.cc",0x1b6,
      "line %d",0x1b6);
  matras_touch(&mStack_2b8,0);
  matras_touch(&mStack_2b8,uStack_21c);
  _ok((uint)(AllocatedCount == sVar1 + 5),"AllocatedCount == extents_in_use_before_reserve + 5",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/matras.cc",0x1ba,
      "line %d",0x1ba);
  matras_destroy_read_view(&mStack_2b8,&mStack_240);
  matras_create_read_view(&mStack_2b8,&mStack_240);
  matras_touch(&mStack_2b8,uStack_21c >> 1);
  sVar1 = AllocatedCount;
  matras_touch_reserve(&mStack_2b8,2);
  _ok((uint)(AllocatedCount == sVar1 + 4),"AllocatedCount == extents_in_use_before_reserve + 4",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/matras.cc",0x1c7,
      "line %d",0x1c7);
  matras_touch(&mStack_2b8,0);
  matras_touch(&mStack_2b8,uStack_21c);
  _ok((uint)(AllocatedCount == sVar1 + 4),"AllocatedCount == extents_in_use_before_reserve + 4",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/matras.cc",0x1cb,
      "line %d",0x1cb);
  do {
    uVar2 = rand();
    matras_touch_reserve(&mStack_2b8,uVar2 & 0xff);
    sVar1 = AllocatedCount;
    for (uVar2 = uVar2 & 0xff; uVar2 != 0; uVar2 = uVar2 - 1) {
      uVar3 = rand();
      matras_touch(&mStack_2b8,uVar3 & 0xff);
    }
    if (AllocatedCount != sVar1) goto LAB_00104556;
    iVar6 = iVar6 + 1;
  } while (iVar6 != 10000);
  iVar6 = 0;
  while( true ) {
    matras_destroy_read_view(&mStack_2b8,&mStack_240);
    matras_create_read_view(&mStack_2b8,&mStack_240);
    uVar2 = rand();
    matras_touch_reserve(&mStack_2b8,uVar2 & 0xff);
    sVar1 = AllocatedCount;
    for (uVar2 = uVar2 & 0xff; uVar2 != 0; uVar2 = uVar2 - 1) {
      uVar3 = rand();
      matras_touch(&mStack_2b8,uVar3 & 0xff);
    }
    if (AllocatedCount != sVar1) break;
    iVar6 = iVar6 + 1;
    if (iVar6 == 10000) {
      matras_destroy_read_view(&mStack_2b8,&mStack_240);
      matras_destroy(&mStack_2b8);
      _space(_stdout);
      printf("# *** %s: done ***\n","matras_touch_reserve_test");
      check_plan();
      return;
    }
  }
LAB_0010455b:
  matras_touch_reserve_test();
  plan(7);
  _space(_stdout);
  printf("# *** %s ***\n","main");
  matras_allocator_create(&pta_allocator,0x40,pta_alloc,pta_free);
  matras_allocator_create(&ver_allocator,0x200,all,dea);
  matras_alloc_test();
  matras_vers_test();
  matras_gh_1145_test();
  matras_stats_test();
  matras_alloc_overflow_test();
  matras_alloc_range_overflow_test();
  matras_touch_reserve_test();
  matras_allocator_destroy(&pta_allocator);
  matras_allocator_destroy(&ver_allocator);
  _space(_stdout);
  printf("# *** %s: done ***\n","main");
  check_plan();
  return;
LAB_00104556:
  matras_touch_reserve_test();
  goto LAB_0010455b;
}

Assistant:

void
matras_stats_test()
{
	header();
	plan(12);

	struct matras_stats stats;
	matras_stats_create(&stats);
	ok(stats.extent_count == 0);
	ok(stats.read_view_extent_count == 0);

	extents_in_use = 0;
	struct matras matras;
	matras_create(&matras, sizeof(type_t), &ver_allocator, &stats);
	ok(stats.extent_count == 0);
	ok(stats.read_view_extent_count == 0);

	matras_id_t id;
	fail_unless(matras_alloc(&matras, &id) != NULL);
	ok(stats.extent_count == 3);
	ok(stats.read_view_extent_count == 0);

	struct matras_view view;
	matras_create_read_view(&matras, &view);
	fail_unless(matras_touch(&matras, id) != NULL);
	ok(stats.extent_count == 6);
	ok(stats.read_view_extent_count == 3);

	matras_destroy_read_view(&matras, &view);
	ok(stats.extent_count == 3);
	ok(stats.read_view_extent_count == 0);

	matras_destroy(&matras);
	ok(stats.extent_count == 0);
	ok(stats.read_view_extent_count == 0);

	footer();
	check_plan();
}